

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O3

void __thiscall soplex::SPxSteepPR<double>::setRep(SPxSteepPR<double> *this,Representation param_1)

{
  SPxSolverBase<double> *pSVar1;
  VectorBase<double> tmp;
  vector<double,_std::allocator<double>_> local_30;
  
  pSVar1 = (this->super_SPxPricer<double>).thesolver;
  if ((pSVar1->thecovectors->set).thenum !=
      (int)((ulong)((long)(this->workVec).super_VectorBase<double>.val.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->workVec).super_VectorBase<double>.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3)) {
    std::vector<double,_std::allocator<double>_>::vector(&local_30,&(pSVar1->weights).val);
    pSVar1 = (this->super_SPxPricer<double>).thesolver;
    std::vector<double,_std::allocator<double>_>::reserve
              (&(pSVar1->weights).val,
               (long)(int)((ulong)((long)(pSVar1->coWeights).val.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_finish -
                                  (long)(pSVar1->coWeights).val.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start) >> 3));
    std::vector<double,_std::allocator<double>_>::operator=
              (&(pSVar1->weights).val,&(pSVar1->coWeights).val);
    VectorBase<double>::operator=
              (&((this->super_SPxPricer<double>).thesolver)->coWeights,
               (VectorBase<double> *)&local_30);
    SSVectorBase<double>::clear(&this->workVec);
    SSVectorBase<double>::reDim
              (&this->workVec,
               (((this->super_SPxPricer<double>).thesolver)->thecovectors->set).thenum);
    if (local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void SPxSteepPR<R>::setRep(typename SPxSolverBase<R>::Representation)
{
   if(workVec.dim() != this->thesolver->dim())
   {
      VectorBase<R> tmp = this->thesolver->weights;
      this->thesolver->weights = this->thesolver->coWeights;
      this->thesolver->coWeights = tmp;

      workVec.clear();
      workVec.reDim(this->thesolver->dim());
   }
}